

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

int __thiscall String::compare(String *this,String *other)

{
  byte *local_30;
  char *s2;
  char *s1;
  String *other_local;
  String *this_local;
  
  s2 = operator_cast_to_char_(this);
  local_30 = (byte *)operator_cast_to_char_(other);
  while( true ) {
    if (*s2 != *local_30) {
      return (uint)(byte)*s2 - (uint)*local_30;
    }
    if (*s2 == '\0') break;
    s2 = s2 + 1;
    local_30 = local_30 + 1;
  }
  return 0;
}

Assistant:

int compare(const String& other) const
  {
    const char* s1 = *this, * s2 = other;
    for(; *s1 == *s2; ++s1, ++s2)
      if(!*s1)
        return 0;
    return (int)*(const uchar*)s1 - *(const uchar*)s2;

  }